

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predict.hpp
# Opt level: O0

void traverse_itree_fast<float,int>
               (vector<IsoTree,_std::allocator<IsoTree>_> *tree,IsoForest *model_outputs,
               float *row_numeric_data,double *output_depth,int *tree_num,double *tree_depth,
               size_t row)

{
  float fVar1;
  reference pvVar2;
  double *in_RCX;
  long in_RDX;
  vector<IsoTree,_std::allocator<IsoTree>_> *in_RDI;
  long in_R8;
  double *in_R9;
  long in_stack_00000008;
  double xval;
  size_t curr_lev;
  size_t local_58;
  size_type local_38;
  
  local_38 = 0;
  while( true ) {
    pvVar2 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[](in_RDI,local_38);
    if (pvVar2->tree_left == 0) break;
    pvVar2 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[](in_RDI,local_38);
    fVar1 = *(float *)(in_RDX + pvVar2->col_num * 4);
    pvVar2 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[](in_RDI,local_38);
    if (pvVar2->num_split < (double)fVar1) {
      pvVar2 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[](in_RDI,local_38);
      local_58 = pvVar2->tree_right;
    }
    else {
      pvVar2 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[](in_RDI,local_38);
      local_58 = pvVar2->tree_left;
    }
    local_38 = local_58;
  }
  pvVar2 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[](in_RDI,local_38);
  *in_RCX = pvVar2->score + *in_RCX;
  if (in_R8 != 0) {
    *(int *)(in_R8 + in_stack_00000008 * 4) = (int)local_38;
  }
  if (in_R9 != (double *)0x0) {
    pvVar2 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[](in_RDI,local_38);
    *in_R9 = pvVar2->score;
  }
  return;
}

Assistant:

void traverse_itree_fast(std::vector<IsoTree>  &tree,
                         IsoForest             &model_outputs,
                         real_t *restrict      row_numeric_data,
                         double &restrict      output_depth,
                         sparse_ix *restrict   tree_num,
                         double *restrict      tree_depth,
                         size_t                row) noexcept
{
    size_t curr_lev = 0;
    double xval;
    while (true)
    {
        if (unlikely(tree[curr_lev].tree_left == 0))
        {
            output_depth += tree[curr_lev].score;
            if (unlikely(tree_num != NULL))
                tree_num[row] = curr_lev;
            if (unlikely(tree_depth != NULL))
                *tree_depth = tree[curr_lev].score;
            break;
        }

        else
        {
            xval     = row_numeric_data[tree[curr_lev].col_num];
            curr_lev = (xval <= tree[curr_lev].num_split)?
                        tree[curr_lev].tree_left : tree[curr_lev].tree_right;
        }
    }
}